

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O3

char * uo_json_encode_utf8(char *dst,char *src,size_t src_len)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  size_t sVar5;
  
  if (src == (char *)0x0) {
    builtin_strncpy(dst,"null",5);
    pbVar4 = (byte *)(dst + 4);
  }
  else {
    *dst = '\"';
    pbVar4 = (byte *)(dst + 1);
    if (src_len != 0) {
      ppuVar3 = __ctype_b_loc();
      sVar5 = 0;
      do {
        bVar1 = src[sVar5];
        if (((*ppuVar3)[bVar1] & 2) == 0) {
          if ((bVar1 == 0x5c) || (bVar1 == 0x22)) {
            *pbVar4 = 0x5c;
            pbVar4 = pbVar4 + 1;
          }
          *pbVar4 = bVar1;
          pbVar4 = pbVar4 + 1;
        }
        else {
          iVar2 = sprintf((char *)pbVar4,"\\u%04X");
          pbVar4 = pbVar4 + iVar2;
        }
        sVar5 = sVar5 + 1;
      } while (src_len != sVar5);
    }
    *pbVar4 = 0x22;
    pbVar4 = pbVar4 + 1;
  }
  return (char *)pbVar4;
}

Assistant:

char *uo_json_encode_utf8(
    char *dst,
    const char *src,
    size_t src_len)
{
    if (!src)
        return uo_json_encode_null(dst);

    const unsigned char *u8 = (unsigned char *)src;
    unsigned char *p = (unsigned char *)dst;
    *p++ = '"';

    while (src_len--)
    {
        unsigned char c = *u8++;

        if (iscntrl(c))
        {
            p += sprintf(p, "\\u%04X", c);
            continue;
        }

        if (c == '"' || c == '\\')
            *p++ = '\\';

        *p++ = c;
    }

    *p++ = '"';
    return p;
}